

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

void aom_hadamard_4x4_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int16_t *piVar12;
  int i;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar20;
  undefined1 in_XMM0 [16];
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar22;
  undefined2 uVar28;
  undefined2 uVar29;
  int iVar30;
  undefined2 uVar31;
  int iVar32;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar27 [16];
  int iVar35;
  undefined4 uVar36;
  undefined1 auVar37 [12];
  int iVar48;
  undefined1 in_XMM2 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  int iVar49;
  int iVar51;
  undefined1 auVar45 [16];
  undefined8 uVar50;
  short sVar56;
  undefined4 uVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined4 uVar58;
  int iVar59;
  int iVar63;
  int iVar64;
  undefined1 auVar60 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar67 [16];
  undefined8 local_58;
  ulong local_50;
  int16_t buffer [16];
  int16_t buffer2 [16];
  undefined1 auVar24 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  int iVar47;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  lVar13 = 0;
  do {
    sVar56 = *src_diff;
    sVar1 = src_diff[src_stride];
    sVar2 = src_diff[src_stride * 2];
    sVar3 = src_diff[src_stride * 3];
    sVar5 = (short)((int)sVar3 + (int)sVar2 >> 1);
    sVar6 = (short)((int)sVar1 + (int)sVar56 >> 1);
    *(short *)((long)&local_58 + lVar13 * 2) = sVar5 + sVar6;
    sVar2 = (short)((int)sVar2 - (int)sVar3 >> 1);
    sVar56 = (short)((int)sVar56 - (int)sVar1 >> 1);
    *(short *)((long)&local_58 + lVar13 * 2 + 2) = sVar2 + sVar56;
    *(short *)((long)&local_58 + lVar13 * 2 + 4) = sVar6 - sVar5;
    *(short *)((long)&local_58 + lVar13 * 2 + 6) = sVar56 - sVar2;
    src_diff = src_diff + 1;
    lVar13 = lVar13 + 4;
  } while ((int)lVar13 != 0x10);
  uVar31 = (undefined2)(local_58 >> 0x30);
  auVar53._0_12_ = in_XMM0._0_12_;
  auVar53._12_2_ = in_XMM0._6_2_;
  auVar53._14_2_ = uVar31;
  auVar26._12_4_ = auVar53._12_4_;
  auVar26._0_10_ = in_XMM0._0_10_;
  uVar29 = (undefined2)(local_58 >> 0x20);
  auVar26._10_2_ = uVar29;
  auVar18._10_6_ = auVar26._10_6_;
  auVar18._0_8_ = in_XMM0._0_8_;
  auVar18._8_2_ = in_XMM0._4_2_;
  uVar28 = (undefined2)(local_58 >> 0x10);
  auVar7._4_8_ = auVar18._8_8_;
  auVar7._2_2_ = uVar28;
  auVar7._0_2_ = in_XMM0._2_2_;
  auVar40._0_12_ = in_XMM2._0_12_;
  auVar40._12_2_ = in_XMM2._6_2_;
  auVar40._14_2_ = (short)(local_50 >> 0x30);
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = in_XMM2._0_10_;
  auVar39._10_2_ = (short)(local_50 >> 0x20);
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = in_XMM2._0_8_;
  auVar38._8_2_ = in_XMM2._4_2_;
  sVar56 = (short)(local_50 >> 0x10);
  auVar8._4_8_ = auVar38._8_8_;
  auVar8._2_2_ = sVar56;
  auVar8._0_2_ = in_XMM2._2_2_;
  auVar41._0_4_ = (int)(short)local_50;
  iVar47 = auVar8._0_4_ >> 0x10;
  auVar37._0_8_ = CONCAT44(iVar47,auVar41._0_4_);
  auVar37._8_4_ = auVar38._8_4_ >> 0x10;
  auVar44._12_2_ = sVar56 >> 0xf;
  auVar44._0_12_ = auVar37;
  auVar44._14_2_ = SUB82(buffer._0_8_,6);
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = auVar37._0_10_;
  auVar43._10_2_ = SUB82(buffer._0_8_,4);
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._8_2_ = sVar56;
  auVar42._0_8_ = auVar37._0_8_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = SUB82(buffer._0_8_,2);
  auVar41._4_2_ = (short)local_50 >> 0xf;
  auVar69._0_12_ = in_XMM6._0_12_;
  auVar69._12_2_ = in_XMM6._6_2_;
  auVar69._14_2_ = SUB82(buffer._8_8_,6);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._0_10_ = in_XMM6._0_10_;
  auVar68._10_2_ = SUB82(buffer._8_8_,4);
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._0_8_ = in_XMM6._0_8_;
  auVar67._8_2_ = in_XMM6._4_2_;
  auVar9._4_8_ = auVar67._8_8_;
  auVar9._2_2_ = SUB82(buffer._8_8_,2);
  auVar9._0_2_ = in_XMM6._2_2_;
  uVar4 = local_50 & local_58;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_50 ^ local_58;
  auVar53 = psraw(auVar52,1);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = local_58;
  auVar55._12_2_ = uVar31;
  auVar55._14_2_ = auVar53._6_2_ + (short)(uVar4 >> 0x30);
  auVar24._12_4_ = auVar55._12_4_;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = local_58;
  auVar24._10_2_ = auVar53._4_2_ + (short)(uVar4 >> 0x20);
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._8_2_ = uVar29;
  auVar23._0_8_ = local_58;
  auVar10._4_8_ = auVar23._8_8_;
  auVar10._2_2_ = auVar53._2_2_ + (short)(uVar4 >> 0x10);
  auVar10._0_2_ = uVar28;
  iVar22 = (int)(short)(auVar53._0_2_ + (short)uVar4);
  iVar30 = auVar10._0_4_ >> 0x10;
  iVar32 = auVar23._8_4_ >> 0x10;
  uVar4 = buffer._8_8_ & buffer._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = buffer._8_8_ ^ buffer._0_8_;
  auVar53 = psraw(auVar65,1);
  auVar62._8_4_ = 0;
  auVar62._0_2_ = buffer[0];
  auVar62._2_2_ = buffer[1];
  auVar62._4_2_ = buffer[2];
  auVar62._6_2_ = buffer[3];
  auVar62._12_2_ = SUB82(buffer._0_8_,6);
  auVar62._14_2_ = auVar53._6_2_ + (short)(uVar4 >> 0x30);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_2_ = buffer[0];
  auVar61._2_2_ = buffer[1];
  auVar61._4_2_ = buffer[2];
  auVar61._6_2_ = buffer[3];
  auVar61._10_2_ = auVar53._4_2_ + (short)(uVar4 >> 0x20);
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = SUB82(buffer._0_8_,4);
  auVar60._0_2_ = buffer[0];
  auVar60._2_2_ = buffer[1];
  auVar60._4_2_ = buffer[2];
  auVar60._6_2_ = buffer[3];
  auVar11._4_8_ = auVar60._8_8_;
  auVar11._2_2_ = auVar53._2_2_ + (short)(uVar4 >> 0x10);
  auVar11._0_2_ = SUB82(buffer._0_8_,2);
  iVar59 = (int)(short)(auVar53._0_2_ + (short)uVar4);
  iVar63 = auVar11._0_4_ >> 0x10;
  iVar64 = auVar60._8_4_ >> 0x10;
  iVar15 = (short)local_58 - auVar41._0_4_ >> 1;
  iVar47 = (auVar7._0_4_ >> 0x10) - iVar47 >> 1;
  iVar20 = (auVar18._8_4_ >> 0x10) - auVar37._8_4_ >> 1;
  iVar21 = (auVar26._12_4_ >> 0x10) - (auVar39._12_4_ >> 0x10) >> 1;
  iVar35 = (int)(short)buffer._0_8_ - (int)(short)buffer._8_8_ >> 1;
  iVar48 = (auVar41._4_4_ >> 0x10) - (auVar9._0_4_ >> 0x10) >> 1;
  iVar49 = (auVar42._8_4_ >> 0x10) - (auVar67._8_4_ >> 0x10) >> 1;
  iVar51 = (auVar43._12_4_ >> 0x10) - (auVar68._12_4_ >> 0x10) >> 1;
  auVar66._0_4_ = (iVar35 + iVar15) * 0x10000 >> 0x10;
  auVar66._4_4_ = (iVar48 + iVar47) * 0x10000 >> 0x10;
  auVar66._8_4_ = (iVar49 + iVar20) * 0x10000 >> 0x10;
  auVar66._12_4_ = (iVar51 + iVar21) * 0x10000 >> 0x10;
  auVar54._0_4_ = (iVar59 + iVar22) * 0x10000 >> 0x10;
  auVar54._4_4_ = (iVar63 + iVar30) * 0x10000 >> 0x10;
  auVar54._8_4_ = (iVar64 + iVar32) * 0x10000 >> 0x10;
  auVar54._12_4_ = ((auVar61._12_4_ >> 0x10) + (auVar24._12_4_ >> 0x10)) * 0x10000 >> 0x10;
  auVar55 = packssdw(auVar54,auVar66);
  auVar16._0_4_ = (iVar15 - iVar35) * 0x10000 >> 0x10;
  auVar16._4_4_ = (iVar47 - iVar48) * 0x10000 >> 0x10;
  auVar16._8_4_ = (iVar20 - iVar49) * 0x10000 >> 0x10;
  auVar16._12_4_ = (iVar21 - iVar51) * 0x10000 >> 0x10;
  auVar25._0_4_ = (iVar22 - iVar59) * 0x10000 >> 0x10;
  auVar25._4_4_ = (iVar30 - iVar63) * 0x10000 >> 0x10;
  auVar25._8_4_ = (iVar32 - iVar64) * 0x10000 >> 0x10;
  auVar25._12_4_ = ((auVar24._12_4_ >> 0x10) - (auVar61._12_4_ >> 0x10)) * 0x10000 >> 0x10;
  auVar26 = packssdw(auVar25,auVar16);
  uVar33 = auVar26._8_4_;
  uVar34 = auVar26._12_4_;
  auVar17._4_4_ = uVar33;
  auVar17._0_4_ = auVar26._0_4_;
  auVar17._8_4_ = uVar33;
  auVar17._12_4_ = uVar34;
  auVar18 = pshuflw(auVar17,auVar17,0xd8);
  uVar57 = auVar55._8_4_;
  uVar58 = auVar55._12_4_;
  auVar45._4_4_ = uVar57;
  auVar45._0_4_ = auVar55._0_4_;
  auVar45._8_4_ = uVar57;
  auVar45._12_4_ = uVar58;
  auVar53 = pshuflw(auVar45,auVar45,0xd8);
  auVar46._0_8_ = auVar53._0_8_;
  auVar46._8_4_ = auVar53._4_4_;
  auVar46._12_4_ = auVar18._4_4_;
  uVar50 = auVar46._8_8_;
  uVar36 = auVar53._0_4_;
  auVar19._4_4_ = auVar26._4_4_;
  auVar19._0_4_ = uVar34;
  auVar19._8_4_ = uVar33;
  auVar19._12_4_ = uVar34;
  pshuflw(auVar19,auVar19,0x72);
  auVar27._4_4_ = auVar55._4_4_;
  auVar27._0_4_ = uVar58;
  auVar27._8_4_ = uVar57;
  auVar27._12_4_ = uVar58;
  pshuflw(auVar27,auVar27,0x72);
  piVar12 = buffer + 8;
  buffer[8] = (int16_t)uVar36;
  buffer[9] = (int16_t)((uint)uVar36 >> 0x10);
  buffer[10] = (int16_t)auVar18._0_4_;
  buffer[0xb] = (int16_t)((uint)auVar18._0_4_ >> 0x10);
  buffer[0xc] = (int16_t)uVar50;
  buffer[0xd] = SUB82(uVar50,2);
  buffer[0xe] = SUB82(uVar50,4);
  buffer[0xf] = SUB82(uVar50,6);
  lVar13 = 0;
  do {
    lVar14 = 0;
    do {
      coeff[lVar14] = (int)piVar12[lVar14 * 4];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar13 = lVar13 + 1;
    coeff = coeff + 4;
    piVar12 = piVar12 + 1;
  } while (lVar13 != 4);
  return;
}

Assistant:

void aom_hadamard_4x4_c(const int16_t *src_diff, ptrdiff_t src_stride,
                        tran_low_t *coeff) {
  int idx;
  int16_t buffer[16];
  int16_t buffer2[16];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 4; ++idx) {
    hadamard_col4(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 4;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 4; ++idx) {
    hadamard_col4(tmp_buf, 4, buffer2 + 4 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_4x4_sse2).
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      coeff[i * 4 + j] = (tran_low_t)buffer2[j * 4 + i];
    }
  }
}